

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters
          (PlanningUnitMADPDiscreteParameters *this)

{
  PlanningUnitMADPDiscreteParameters *this_local;
  
  this->_m_individualObservationHistories = true;
  this->_m_individualActionHistories = true;
  this->_m_individualActionObservationHistories = true;
  this->_m_jointObservationHistories = true;
  this->_m_jointActionHistories = true;
  this->_m_jointActionObservationHistories = true;
  this->_m_JointBeliefs = true;
  this->_m_useSparseBeliefs = false;
  this->_m_eventObservability = false;
  return;
}

Assistant:

PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters()
{
    _m_individualObservationHistories=true;
    _m_individualActionHistories=true;
    _m_individualActionObservationHistories=true;
    _m_jointObservationHistories=true;
    _m_jointActionHistories=true;
    _m_jointActionObservationHistories=true;
    _m_JointBeliefs=true;
    _m_useSparseBeliefs=false;
    _m_eventObservability=false;
}